

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

ptr<Statement> __thiscall Parser::ifStatement(Parser *this)

{
  bool bVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Parser *in_RSI;
  ptr<Statement> pVar2;
  shared_ptr<Expression> local_78;
  shared_ptr<StatementBlock> local_68;
  undefined1 local_58 [8];
  ptr<StatementBlock> elseBlock;
  undefined1 local_38 [8];
  ptr<StatementBlock> ifBlock;
  ptr<Expression> condition;
  Parser *this_local;
  
  consume(in_RSI);
  expression((Parser *)
             &ifBlock.super___shared_ptr<StatementBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  statementBlock((Parser *)local_38);
  std::shared_ptr<StatementBlock>::shared_ptr((shared_ptr<StatementBlock> *)local_58);
  bVar1 = match(in_RSI,Else);
  if (bVar1) {
    consume(in_RSI);
    statementBlock((Parser *)&local_68);
    std::shared_ptr<StatementBlock>::operator=((shared_ptr<StatementBlock> *)local_58,&local_68);
    std::shared_ptr<StatementBlock>::~shared_ptr(&local_68);
  }
  make<IfStatement,std::shared_ptr<Expression>&,std::shared_ptr<StatementBlock>&,std::shared_ptr<StatementBlock>&>
            (&local_78,
             (shared_ptr<StatementBlock> *)
             &ifBlock.super___shared_ptr<StatementBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (shared_ptr<StatementBlock> *)local_38);
  std::shared_ptr<Statement>::shared_ptr<IfStatement,void>
            ((shared_ptr<Statement> *)this,(shared_ptr<IfStatement> *)&local_78);
  std::shared_ptr<IfStatement>::~shared_ptr((shared_ptr<IfStatement> *)&local_78);
  std::shared_ptr<StatementBlock>::~shared_ptr((shared_ptr<StatementBlock> *)local_58);
  std::shared_ptr<StatementBlock>::~shared_ptr((shared_ptr<StatementBlock> *)local_38);
  std::shared_ptr<Expression>::~shared_ptr
            ((shared_ptr<Expression> *)
             &ifBlock.super___shared_ptr<StatementBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  pVar2.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar2.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Statement>)pVar2.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Statement> Parser::ifStatement() {
    consume();
    ptr<Expression> condition = expression();
    ptr<StatementBlock> ifBlock = statementBlock();
    ptr<StatementBlock> elseBlock;

    if(match(TokenType::Else)) {
        consume();
        elseBlock = statementBlock();
    }

    return make<IfStatement>(condition, ifBlock, elseBlock);
}